

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

void cio_b64_encode_buffer(uint8_t *in,size_t in_length,char *out)

{
  char *pcVar1;
  undefined4 local_38;
  uint local_34;
  char tmp [4];
  uint i;
  uint triple [3];
  uint len;
  char *out_local;
  size_t in_length_local;
  uint8_t *in_local;
  
  unique0x100000ca = out;
  out_local = (char *)in_length;
  in_length_local = (size_t)in;
  while (out_local != (char *)0x0) {
    triple[1] = 0;
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      if (out_local == (char *)0x0) {
        pcVar1 = tmp + (ulong)local_34 * 4;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
      }
      else {
        *(uint *)(tmp + (ulong)local_34 * 4) = (uint)*(byte *)in_length_local;
        triple[1] = triple[1] + 1;
        out_local = out_local + -1;
        in_length_local = in_length_local + 1;
      }
    }
    local_38._0_2_ =
         CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [((uint)tmp & 3) << 4 | (i & 0xf0) >> 4],
                  "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(uint)tmp >> 2]
                 );
    if (triple[1] < 2) {
      local_38._0_3_ = CONCAT12(0x3d,(undefined2)local_38);
    }
    else {
      local_38._0_3_ =
           CONCAT12("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(i & 0xf) << 2 | (triple[0] & 0xc0) >> 6],(undefined2)local_38);
    }
    if (triple[1] < 3) {
      local_38 = CONCAT13(0x3d,(undefined3)local_38);
    }
    else {
      local_38 = CONCAT13("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                          [triple[0] & 0x3f],(undefined3)local_38);
    }
    *(undefined4 *)stack0xffffffffffffffe0 = local_38;
    register0x00000000 = stack0xffffffffffffffe0 + 4;
  }
  return;
}

Assistant:

void cio_b64_encode_buffer(const uint8_t *__restrict in, size_t in_length, char *__restrict out)
{
	while (in_length) {
		unsigned int len = 0;
		unsigned int triple[3];
		for (unsigned int i = 0; i < 3; i++) {
			if (in_length) {
				triple[i] = *in++;
				len++;
				in_length--;
			} else {
				triple[i] = 0;
			}
		}

		char tmp[4];
		tmp[0] = ENCODE_TABLE[triple[0] >> 2U];
		tmp[1] = ENCODE_TABLE[((triple[0] & 0x03U) << 4U) | ((triple[1] & 0xf0U) >> 4U)]; // NOLINT
		if (cio_likely(len > 1)) {
			tmp[2] = ENCODE_TABLE[((triple[1] & 0x0fU) << 2U) | ((triple[2] & 0xc0U) >> 6U)]; // NOLINT
		} else {
			tmp[2] = '=';
		}
		if (cio_likely(len > 2)) {
			tmp[3] = ENCODE_TABLE[triple[2] & 0x3fU]; // NOLINT
		} else {
			tmp[3] = '=';
		}
		memcpy(out, tmp, sizeof(tmp));
		out += 4;
	}
}